

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::SingleVertexArrayOutputTypeTests::init
          (SingleVertexArrayOutputTypeTests *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  OutputType outputType_;
  GLValue max_;
  bool bVar1;
  MultiVertexArrayTest *this_00;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  GLValue GVar6;
  string name;
  Spec spec;
  ArraySpec arraySpec;
  int local_f0;
  string local_d8;
  undefined1 local_b8 [16];
  pointer local_a8;
  pointer pAStack_a0;
  pointer local_98;
  InputType local_90;
  undefined4 uStack_8c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_88;
  InputType local_80;
  undefined4 uStack_7c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_78;
  ArraySpec local_70;
  
  lVar3 = 0;
  do {
    type = (&DAT_01bc2960)[lVar3];
    lVar2 = 0;
    do {
      outputType_ = (&DAT_01bc2978)[lVar2];
      local_f0 = 2;
      do {
        lVar4 = 0;
        bVar1 = true;
        do {
          bVar5 = bVar1;
          GVar6 = deqp::gls::GLValue::getMinValue(type);
          aStack_78 = GVar6.field_1;
          local_80 = GVar6.type;
          GVar6 = deqp::gls::GLValue::getMaxValue(type);
          aStack_88 = GVar6.field_1;
          local_90 = GVar6.type;
          max_._4_4_ = uStack_8c;
          max_.type = local_90;
          GVar6._4_4_ = uStack_7c;
          GVar6.type = local_80;
          GVar6.field_1 = aStack_78;
          max_.field_1 = aStack_88;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    (&local_70,type,outputType_,STORAGE_USER,USAGE_DYNAMIC_DRAW,local_f0,0,0,false,
                     GVar6,max_);
          local_a8 = (pointer)0x0;
          pAStack_a0 = (pointer)0x0;
          local_98 = (pointer)0x0;
          local_b8._0_4_ = PRIMITIVE_TRIANGLES;
          local_b8._4_4_ = (&DAT_01bc2920)[lVar4];
          local_b8._8_4_ = 0;
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
          ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                    ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                      *)&local_a8,(iterator)0x0,&local_70);
          deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_(&local_d8,(Spec *)local_b8);
          this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
          deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                    (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,
                     (Spec *)local_b8,local_d8._M_dataplus._M_p,local_d8._M_dataplus._M_p);
          tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if (local_a8 != (pointer)0x0) {
            operator_delete(local_a8,(long)local_98 - (long)local_a8);
          }
          lVar4 = 1;
          bVar1 = false;
        } while (bVar5);
        local_f0 = local_f0 + 1;
      } while (local_f0 != 5);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  return 5;
}

Assistant:

void SingleVertexArrayOutputTypeTests::init (void)
{
	// Test output types with different input types, component counts and storage, Usage?, Precision?, float?
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_UNSIGNED_SHORT, Array::INPUTTYPE_UNSIGNED_BYTE, Array::INPUTTYPE_FIXED};
	Array::OutputType	outputTypes[]	= {Array::OUTPUTTYPE_VEC2, Array::OUTPUTTYPE_VEC3, Array::OUTPUTTYPE_VEC4};
	Array::Storage		storages[]		= {Array::STORAGE_USER};
	int					counts[]		= {1, 256};

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int outputTypeNdx = 0; outputTypeNdx < DE_LENGTH_OF_ARRAY(outputTypes); outputTypeNdx++)
		{
			for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
			{
				for (int componentCount = 2; componentCount < 5; componentCount++)
				{
					for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
					{
						MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																		outputTypes[outputTypeNdx],
																		storages[storageNdx],
																		Array::USAGE_DYNAMIC_DRAW,
																		componentCount,
																		0,
																		0,
																		false,
																		GLValue::getMinValue(inputTypes[inputTypeNdx]),
																		GLValue::getMaxValue(inputTypes[inputTypeNdx]));

						MultiVertexArrayTest::Spec spec;
						spec.primitive	= Array::PRIMITIVE_TRIANGLES;
						spec.drawCount	= counts[countNdx];
						spec.first		= 0;
						spec.arrays.push_back(arraySpec);

						std::string name = spec.getName();
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
					}
				}
			}
		}
	}
}